

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O2

int nni_taskq_sys_init(nng_init_params *params)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  
  uVar2 = params->max_task_threads;
  uVar1 = params->num_task_threads;
  uVar4 = uVar2;
  if ((short)uVar1 < (short)uVar2) {
    uVar4 = uVar1;
  }
  if ((short)uVar2 < 1) {
    uVar4 = uVar1;
  }
  uVar2 = 2;
  if (2 < (short)uVar4) {
    uVar2 = uVar4;
  }
  params->num_task_threads = uVar2;
  iVar3 = nni_taskq_init(&nni_taskq_systq,(uint)uVar2);
  return iVar3;
}

Assistant:

int
nni_taskq_sys_init(nng_init_params *params)
{
	int16_t num_thr;
	int16_t max_thr;

	max_thr = params->max_task_threads;
	num_thr = params->num_task_threads;

	if ((max_thr > 0) && (num_thr > max_thr)) {
		num_thr = max_thr;
	}
	if (num_thr < 2) {
		num_thr = 2;
	}
	params->num_task_threads = num_thr;

	return (nni_taskq_init(&nni_taskq_systq, (int) num_thr));
}